

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void __thiscall E64::command_t::memory_dump(command_t *this,uint32_t address,int rows)

{
  uint uVar1;
  int in_EDX;
  uint in_ESI;
  uint8_t temp_byte;
  int i_2;
  int i_1;
  uint32_t temp_address;
  int i;
  char in_stack_ffffffffffffffcf;
  tty_t *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  int local_20;
  uint local_1c;
  int local_14;
  uint local_c;
  
  local_c = in_ESI & 0xfffffffe;
  for (local_14 = 0; local_14 < in_EDX; local_14 = local_14 + 1) {
    tty_t::print(monitor.tty,"\r:%06x ",(ulong)local_c);
    for (local_1c = 0; (int)local_1c < 8; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = monitor.tty;
      uVar1 = mmu_ic::read_memory_8
                        ((mmu_ic *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                         (uint)((ulong)monitor.tty >> 0x20));
      tty_t::print(in_stack_ffffffffffffffd0,"%02x",(ulong)uVar1);
      if ((local_1c & 1) != 0) {
        tty_t::putchar(monitor.tty,0x20);
      }
    }
    (monitor.tty)->current_background_color = 0x24f2;
    for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
      uVar1 = mmu_ic::read_memory_8
                        ((mmu_ic *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                         (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      in_stack_ffffffffffffffdf = (undefined1)uVar1;
      tty_t::put_screencode(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    }
    local_c = local_c + 8 & 0xffffff;
    (monitor.tty)->current_background_color = 0x12f1;
    (monitor.tty)->cursor_pos = (monitor.tty)->cursor_pos + -0x1c;
  }
  return;
}

Assistant:

void E64::command_t::memory_dump(uint32_t address, int rows)
{
    address = address & 0xfffffffe;  // only even addresses allowed
    
	for (int i=0; i<rows; i++ ) {
		uint32_t temp_address = address;
		monitor.tty->print("\r:%06x ", temp_address);
		for (int i=0; i<8; i++) {
			monitor.tty->print("%02x", machine.mmu->read_memory_8(temp_address));
			if(i & 0b1) monitor.tty->putchar(' ');
			temp_address ++;
			temp_address &= RAM_SIZE - 1;
		}
        
		monitor.tty->current_background_color = COBALT_02;
		
		temp_address = address;
		for (int i=0; i<8; i++) {
			uint8_t temp_byte = machine.mmu->read_memory_8(temp_address);
			monitor.tty->put_screencode(temp_byte);
			temp_address++;
		}
		address += 8;
		address &= RAM_SIZE - 1;
        
		monitor.tty->current_background_color = COBALT_01;
       
		monitor.tty->cursor_pos -= 28;
	}
}